

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall IVmBifTadsRNG::seed_int(IVmBifTadsRNG *this,int32_t i)

{
  size_t sVar1;
  int in_ESI;
  long *in_RDI;
  char buf [40];
  undefined1 local_38 [4];
  char acStack_34 [40];
  int local_c;
  
  local_c = in_ESI;
  ::oswp4(local_38,(long)in_ESI);
  t3sprintf(acStack_34,0x24,"%ld",(long)local_c);
  sVar1 = strlen(acStack_34);
  (**(code **)(*in_RDI + 0x28))(in_RDI,local_38,sVar1 + 4);
  return;
}

Assistant:

virtual void seed_int(int32_t i)
    {
        /* by default, turn this into a string and seed with the string */
        char buf[40];
        oswp4(buf, i);
        t3sprintf(buf+4, sizeof(buf)-4, "%ld", (long)i);
        seed_str(buf, 4 + strlen(buf+4));
    }